

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O3

void duckdb_re2::AppendLiteral(string *t,Rune r,bool foldcase)

{
  void *pvVar1;
  ulong uVar2;
  
  if (r < 0x80 && r != 0) {
    pvVar1 = memchr("(){}[]*+?|.^$\\",r,0xf);
    if (pvVar1 != (void *)0x0) {
      std::__cxx11::string::_M_replace_aux((ulong)t,t->_M_string_length,0,'\x01');
      uVar2 = t->_M_string_length;
      goto LAB_01cb9c6a;
    }
  }
  if (!foldcase || 0x19 < r - 0x61U) {
    AppendCCRange(t,r,r);
    return;
  }
  std::__cxx11::string::_M_replace_aux((ulong)t,t->_M_string_length,0,'\x01');
  std::__cxx11::string::_M_replace_aux((ulong)t,t->_M_string_length,0,'\x01');
  std::__cxx11::string::_M_replace_aux((ulong)t,t->_M_string_length,0,'\x01');
  uVar2 = t->_M_string_length;
LAB_01cb9c6a:
  std::__cxx11::string::_M_replace_aux((ulong)t,uVar2,0,'\x01');
  return;
}

Assistant:

static void AppendLiteral(std::string *t, Rune r, bool foldcase) {
  if (r != 0 && r < 0x80 && strchr("(){}[]*+?|.^$\\", r)) {
    t->append(1, '\\');
    t->append(1, static_cast<char>(r));
  } else if (foldcase && 'a' <= r && r <= 'z') {
    r -= 'a' - 'A';
    t->append(1, '[');
    t->append(1, static_cast<char>(r));
    t->append(1, static_cast<char>(r) + 'a' - 'A');
    t->append(1, ']');
  } else {
    AppendCCRange(t, r, r);
  }
}